

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictbe.cpp
# Opt level: O3

int32_t __thiscall
icu_63::CjkBreakEngine::divideUpDictionaryRange
          (CjkBreakEngine *this,UText *inText,int32_t rangeStart,int32_t rangeEnd,
          UVector32 *foundBreaks)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  _func_int **pp_Var4;
  UBool UVar5;
  UChar32 UVar6;
  undefined4 uVar7;
  int iVar8;
  uint uVar9;
  uint srcChar;
  int64_t iVar10;
  ulong uVar11;
  UVector32 *this_00;
  UVector32 *this_01;
  UnicodeSet *this_02;
  ushort uVar12;
  undefined4 in_register_00000014;
  int iVar13;
  int iVar14;
  uint uVar15;
  int32_t iVar16;
  int32_t iVar17;
  int iVar18;
  size_t sVar19;
  UnicodeString *size;
  int iVar20;
  int32_t i;
  bool bVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  UErrorCode status;
  _func_int **local_238;
  ulong local_230;
  undefined8 local_228;
  CjkBreakEngine *local_220;
  UVector32 t_boundary;
  UnicodeString inString;
  UVector32 bestSnlp;
  ConstChar16Ptr local_160;
  UVector32 prev;
  UVector32 lengths;
  UVector32 values;
  UText fu;
  
  local_228 = CONCAT44(in_register_00000014,rangeStart);
  uVar11 = (ulong)(uint)rangeEnd;
  if (rangeEnd - rangeStart == 0 || rangeEnd < rangeStart) {
    return 0;
  }
  local_238 = (_func_int **)&PTR__UnicodeString_003b2258;
  inString.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003b2258;
  inString.fUnion.fStackFields.fLengthAndFlags = 2;
  status = U_ZERO_ERROR;
  lVar22 = (long)rangeEnd;
  sVar19 = (size_t)rangeStart;
  local_220 = this;
  if (((((inText->providerProperties & 4) == 0) ||
       (lVar1 = inText->chunkNativeStart, (long)sVar19 < lVar1)) ||
      (inText->chunkNativeLimit < lVar22)) || ((long)inText->nativeIndexingLimit < lVar22 - lVar1))
  {
    utext_setNativeIndex_63(inText,sVar19);
    iVar10 = utext_nativeLength_63(inText);
    if (iVar10 < lVar22) {
      uVar11 = utext_nativeLength_63(inText);
    }
    this_00 = (UVector32 *)UMemory::operator_new((UMemory *)0x20,sVar19);
    if (this_00 != (UVector32 *)0x0) {
      UVector32::UVector32(this_00,&status);
      if (U_ZERO_ERROR < status) {
        (*(this_00->super_UObject)._vptr_UObject[1])(this_00);
        if (U_ZERO_ERROR < status) goto LAB_002e1422;
        this_00 = (UVector32 *)0x0;
      }
      local_230 = uVar11;
      while (iVar10 = utext_getNativeIndex_63(inText), uVar23 = local_230, iVar10 < (int)uVar11) {
        iVar10 = utext_getNativeIndex_63(inText);
        UVar6 = utext_next32_63(inText);
        UnicodeString::append(&inString,UVar6);
        uVar7 = inString.fUnion.fFields.fLength;
        if (-1 < inString.fUnion.fStackFields.fLengthAndFlags) {
          uVar7 = (int)inString.fUnion.fStackFields.fLengthAndFlags >> 5;
        }
        iVar17 = this_00->count;
        while (iVar17 < (int)uVar7) {
          if ((iVar17 < -1) || (this_00->capacity <= iVar17)) {
            UVar5 = UVector32::expandCapacity(this_00,iVar17 + 1,&status);
            iVar17 = this_00->count;
            if (UVar5 != '\0') goto LAB_002e14a0;
          }
          else {
LAB_002e14a0:
            this_00->elements[iVar17] = (int32_t)iVar10;
            iVar17 = this_00->count + 1;
            this_00->count = iVar17;
          }
          uVar7 = inString.fUnion.fFields.fLength;
          if (-1 < inString.fUnion.fStackFields.fLengthAndFlags) {
            uVar7 = (int)inString.fUnion.fStackFields.fLengthAndFlags >> 5;
          }
        }
      }
      iVar8 = this_00->count;
      if ((iVar8 < -1) || (this_00->capacity <= iVar8)) {
        UVar5 = UVector32::expandCapacity(this_00,iVar8 + 1,&status);
        if (UVar5 == '\0') goto LAB_002e14fd;
        iVar8 = this_00->count;
      }
      this_00->elements[iVar8] = (int32_t)uVar23;
      this_00->count = this_00->count + 1;
      goto LAB_002e14fd;
    }
LAB_002e1422:
    iVar17 = 0;
    goto LAB_002e1e77;
  }
  local_160.p_ = inText->chunkContents + (sVar19 - lVar1);
  UnicodeString::setTo(&inString,'\0',&local_160,rangeEnd - rangeStart);
  this_00 = (UVector32 *)0x0;
LAB_002e14fd:
  size = &inString;
  iVar8 = (*(local_220->nfkcNorm2->super_UObject)._vptr_UObject[0xb])
                    (local_220->nfkcNorm2,size,&status);
  pp_Var4 = local_238;
  this_01 = this_00;
  if ((char)iVar8 == '\0') {
    fu._0_8_ = local_238;
    fu.providerProperties._0_2_ = 2;
    this_01 = (UVector32 *)UMemory::operator_new((UMemory *)0x20,(size_t)size);
    if (this_01 == (UVector32 *)0x0) {
      if (status < U_ILLEGAL_ARGUMENT_ERROR) {
        status = U_MEMORY_ALLOCATION_ERROR;
      }
    }
    else {
      UVector32::UVector32(this_01,&status);
      if (status < U_ILLEGAL_ARGUMENT_ERROR) {
        bestSnlp.super_UObject._vptr_UObject = pp_Var4;
        bestSnlp.count = CONCAT22(bestSnlp.count._2_2_,2);
        prev.super_UObject._vptr_UObject = pp_Var4;
        prev.count = CONCAT22(prev.count._2_2_,2);
        uVar7 = inString.fUnion.fFields.fLength;
        if (-1 < inString.fUnion.fStackFields.fLengthAndFlags) {
          uVar7 = (int)inString.fUnion.fStackFields.fLengthAndFlags >> 5;
        }
        if (0 < (int)uVar7) {
          uVar9 = 0;
          do {
            uVar12 = (ushort)bestSnlp.count & 0x1e;
            if ((bestSnlp.count & 1U) != 0) {
              uVar12 = 2;
            }
            bestSnlp.count = CONCAT22(bestSnlp.count._2_2_,uVar12);
            srcChar = UnicodeString::char32At(&inString,uVar9);
            uVar15 = uVar9;
            do {
              UnicodeString::append((UnicodeString *)&bestSnlp,srcChar);
              uVar15 = UnicodeString::moveIndex32(&inString,uVar15,1);
              uVar7 = inString.fUnion.fFields.fLength;
              if (-1 < inString.fUnion.fStackFields.fLengthAndFlags) {
                uVar7 = (int)inString.fUnion.fStackFields.fLengthAndFlags >> 5;
              }
              if (uVar15 == uVar7) break;
              srcChar = UnicodeString::char32At(&inString,uVar15);
              iVar8 = (*(local_220->nfkcNorm2->super_UObject)._vptr_UObject[0xf])
                                (local_220->nfkcNorm2,(ulong)srcChar);
            } while ((char)iVar8 == '\0');
            (*(local_220->nfkcNorm2->super_UObject)._vptr_UObject[3])
                      (local_220->nfkcNorm2,&bestSnlp,&prev,&status);
            iVar17 = prev.capacity;
            if (-1 < (short)prev.count) {
              iVar17 = (int)(short)prev.count >> 5;
            }
            UnicodeString::doAppend((UnicodeString *)&fu,(UnicodeString *)&prev,0,iVar17);
            if (this_00 == (UVector32 *)0x0) {
              iVar17 = uVar9 + (int)local_228;
            }
            else {
              iVar17 = 0;
              if ((-1 < (int)uVar9) && ((int)uVar9 < this_00->count)) {
                iVar17 = this_00->elements[uVar9];
              }
            }
            do {
              iVar8 = fu.sizeOfStruct;
              if (-1 < (short)fu.providerProperties) {
                iVar8 = (int)(short)fu.providerProperties >> 5;
              }
              iVar20 = this_01->count;
              if (iVar8 <= iVar20) break;
              if ((iVar20 < -1) || (this_01->capacity <= iVar20)) {
                UVar5 = UVector32::expandCapacity(this_01,iVar20 + 1,&status);
                if (UVar5 != '\0') {
                  iVar20 = this_01->count;
                  goto LAB_002e2031;
                }
              }
              else {
LAB_002e2031:
                this_01->elements[iVar20] = iVar17;
                this_01->count = this_01->count + 1;
              }
            } while (status < U_ILLEGAL_ARGUMENT_ERROR);
            uVar7 = inString.fUnion.fFields.fLength;
            if (-1 < inString.fUnion.fStackFields.fLengthAndFlags) {
              uVar7 = (int)inString.fUnion.fStackFields.fLengthAndFlags >> 5;
            }
            uVar9 = uVar15;
          } while ((int)uVar15 < (int)uVar7);
        }
        if (this_00 == (UVector32 *)0x0) {
          iVar17 = uVar7 + (int)local_228;
        }
        else {
          iVar17 = 0;
          if ((-1 < (int)uVar7) && (iVar17 = 0, (int)uVar7 < this_00->count)) {
            iVar17 = this_00->elements[(uint)uVar7];
          }
        }
        UVector32::addElement(this_01,iVar17,&status);
        if (this_00 != (UVector32 *)0x0) {
          (*(this_00->super_UObject)._vptr_UObject[1])(this_00);
        }
        UnicodeString::moveFrom(&inString,(UnicodeString *)&fu);
        UnicodeString::~UnicodeString((UnicodeString *)&prev);
        UnicodeString::~UnicodeString((UnicodeString *)&bestSnlp);
        UnicodeString::~UnicodeString((UnicodeString *)&fu);
        goto LAB_002e1520;
      }
      (*(this_01->super_UObject)._vptr_UObject[1])(this_01);
    }
    UnicodeString::~UnicodeString((UnicodeString *)&fu);
    iVar17 = 0;
  }
  else {
LAB_002e1520:
    sVar19 = 0;
    uVar9 = UnicodeString::countChar32(&inString,0,0x7fffffff);
    local_230 = (ulong)uVar9;
    uVar7 = inString.fUnion.fFields.fLength;
    if (-1 < inString.fUnion.fStackFields.fLengthAndFlags) {
      uVar7 = (int)inString.fUnion.fStackFields.fLengthAndFlags >> 5;
    }
    this_00 = this_01;
    if (uVar9 != uVar7) {
      if (this_01 != (UVector32 *)0x0) goto LAB_002e15b9;
      this_00 = (UVector32 *)UMemory::operator_new((UMemory *)0x20,sVar19);
      if (this_00 != (UVector32 *)0x0) {
        UVector32::UVector32(this_00,&status);
        if (status < U_ILLEGAL_ARGUMENT_ERROR) {
LAB_002e15b9:
          iVar8 = 0;
          uVar9 = 0;
          do {
            iVar20 = this_00->count;
            if (this_01 == (UVector32 *)0x0) {
              if ((iVar20 < -1) || (this_00->capacity <= iVar20)) {
                UVar5 = UVector32::expandCapacity(this_00,iVar20 + 1,&status);
                if (UVar5 == '\0') goto LAB_002e1629;
                iVar20 = this_00->count;
              }
              this_00->elements[iVar20] = (int)local_228 + uVar9;
              this_00->count = this_00->count + 1;
            }
            else {
              iVar17 = 0;
              if ((-1 < (int)uVar9) && (iVar17 = 0, (int)uVar9 < iVar20)) {
                iVar17 = this_00->elements[uVar9];
              }
              UVector32::setElementAt(this_00,iVar17,iVar8);
            }
LAB_002e1629:
            uVar7 = inString.fUnion.fFields.fLength;
            if (-1 < inString.fUnion.fStackFields.fLengthAndFlags) {
              uVar7 = (int)inString.fUnion.fStackFields.fLengthAndFlags >> 5;
            }
            if (uVar9 == uVar7) goto LAB_002e1661;
            iVar8 = iVar8 + 1;
            uVar9 = UnicodeString::moveIndex32(&inString,uVar9,1);
          } while( true );
        }
        (*(this_00->super_UObject)._vptr_UObject[1])(this_00);
        if (status < U_ILLEGAL_ARGUMENT_ERROR) {
          this_00 = (UVector32 *)0x0;
          goto LAB_002e15b9;
        }
      }
      goto LAB_002e1422;
    }
LAB_002e1661:
    uVar11 = local_230;
    iVar8 = (int)local_230;
    iVar20 = iVar8 + 1;
    UVector32::UVector32(&bestSnlp,iVar20,&status);
    if (((-2 < bestSnlp.count) && (bestSnlp.count < bestSnlp.capacity)) ||
       (UVar5 = UVector32::expandCapacity(&bestSnlp,bestSnlp.count + 1,&status), UVar5 != '\0')) {
      bestSnlp.elements[bestSnlp.count] = 0;
      bestSnlp.count = bestSnlp.count + 1;
    }
    if (0 < iVar8) {
      uVar23 = uVar11 & 0xffffffff;
      do {
        if (((-2 < bestSnlp.count) && (bestSnlp.count < bestSnlp.capacity)) ||
           (UVar5 = UVector32::expandCapacity(&bestSnlp,bestSnlp.count + 1,&status), UVar5 != '\0'))
        {
          bestSnlp.elements[bestSnlp.count] = -1;
          bestSnlp.count = bestSnlp.count + 1;
        }
        uVar9 = (int)uVar23 - 1;
        uVar23 = (ulong)uVar9;
      } while (uVar9 != 0);
    }
    UVector32::UVector32(&prev,iVar20,&status);
    if (-1 < iVar8) {
      iVar13 = iVar20;
      do {
        if (((-2 < prev.count) && (prev.count < prev.capacity)) ||
           (UVar5 = UVector32::expandCapacity(&prev,prev.count + 1,&status), UVar5 != '\0')) {
          prev.elements[prev.count] = -1;
          prev.count = prev.count + 1;
        }
        iVar13 = iVar13 + -1;
      } while (iVar13 != 0);
    }
    UVector32::UVector32(&values,iVar8,&status);
    UVector32::setSize(&values,iVar8);
    UVector32::UVector32(&lengths,iVar8,&status);
    UVector32::setSize(&lengths,iVar8);
    memset(&fu,0,0x90);
    fu.magic = 0x345ad82c;
    fu.sizeOfStruct = 0x90;
    utext_openUnicodeString_63(&fu,&inString,&status);
    uVar23 = uVar11 & 0xffffffff;
    if (0 < iVar8) {
      this_02 = &local_220->fHangulWordSet;
      uVar24 = 0;
      bVar3 = false;
      local_238 = (_func_int **)((ulong)local_238 & 0xffffffff00000000);
      do {
        if (((long)bestSnlp.count <= (long)uVar24) || (bestSnlp.elements[uVar24] != -1)) {
          utext_setNativeIndex_63(&fu,(long)(int)local_238);
          uVar9 = (*local_220->fDictionary->_vptr_DictionaryMatcher[2])
                            (local_220->fDictionary,&fu,0x14,uVar11 & 0xffffffff,0,lengths.elements,
                             values.elements,0);
          if ((uVar9 == 0) || ((lengths.count < 1 || (*lengths.elements != 1)))) {
            UVar6 = UnicodeString::char32At(&inString,(int)local_238);
            UVar5 = UnicodeSet::contains(this_02,UVar6);
            if (UVar5 == '\0') {
              UVector32::setElementAt(&values,0xff,uVar9);
              UVector32::setElementAt(&lengths,1,uVar9);
              uVar9 = uVar9 + 1;
            }
          }
          iVar8 = (int)uVar24;
          if (0 < (int)uVar9) {
            uVar11 = 0;
            do {
              iVar18 = 0;
              iVar13 = 0;
              if ((long)uVar24 < (long)bestSnlp.count) {
                iVar13 = bestSnlp.elements[uVar24];
              }
              if ((long)uVar11 < (long)values.count) {
                iVar18 = values.elements[uVar11];
              }
              iVar14 = 0;
              if ((long)uVar11 < (long)lengths.count) {
                iVar14 = lengths.elements[uVar11];
              }
              uVar15 = iVar14 + iVar8;
              if (((int)uVar15 < bestSnlp.count && -1 < (int)uVar15) &&
                 ((uint)(iVar18 + iVar13) < (uint)bestSnlp.elements[uVar15])) {
                UVector32::setElementAt(&bestSnlp,iVar18 + iVar13,uVar15);
                UVector32::setElementAt(&prev,iVar8,uVar15);
              }
              uVar11 = uVar11 + 1;
            } while (uVar9 != uVar11);
          }
          UVar6 = UnicodeString::char32At(&inString,(int)local_238);
          uVar11 = local_230;
          bVar21 = UVar6 != 0x30fb && UVar6 - 0x30a1U < 0x5e || UVar6 - 0xff66U < 0x3a;
          bVar2 = !bVar3;
          bVar3 = bVar21;
          if (bVar2 && bVar21 == true) {
            iVar17 = UnicodeString::moveIndex32(&inString,(int)local_238,1);
            uVar7 = inString.fUnion.fFields.fLength;
            if (-1 < inString.fUnion.fStackFields.fLengthAndFlags) {
              uVar7 = (int)inString.fUnion.fStackFields.fLengthAndFlags >> 5;
            }
            uVar9 = 1;
            uVar15 = 1;
            if (iVar17 < (int)uVar7) {
              do {
                uVar15 = uVar9;
                UVar6 = UnicodeString::char32At(&inString,iVar17);
                if ((0x39 < UVar6 - 0xff66U) &&
                   (uVar11 = local_230, UVar6 == 0x30fb || 0x5d < UVar6 - 0x30a1U))
                goto LAB_002e1ada;
                iVar17 = UnicodeString::moveIndex32(&inString,iVar17,1);
                uVar7 = inString.fUnion.fFields.fLength;
                if (-1 < inString.fUnion.fStackFields.fLengthAndFlags) {
                  uVar7 = (int)inString.fUnion.fStackFields.fLengthAndFlags >> 5;
                }
              } while ((iVar17 < (int)uVar7) && (uVar9 = uVar15 + 1, uVar15 < 0x13));
              bVar2 = 0x12 < uVar15;
              uVar11 = local_230;
              uVar15 = uVar15 + 1;
              if (bVar2) goto LAB_002e1b4a;
            }
LAB_002e1ada:
            iVar13 = 0;
            if ((long)uVar24 < (long)bestSnlp.count) {
              iVar13 = bestSnlp.elements[uVar24];
            }
            iVar18 = 0x2000;
            if (uVar15 < 9) {
              iVar18 = *(int *)(getKatakanaCost(int)::katakanaCost + (ulong)uVar15 * 4);
            }
            uVar15 = uVar15 + iVar8;
            if (((int)uVar15 < bestSnlp.count) &&
               ((uint)(iVar18 + iVar13) < (uint)bestSnlp.elements[uVar15])) {
              UVector32::setElementAt(&bestSnlp,iVar18 + iVar13,uVar15);
              UVector32::setElementAt(&prev,iVar8,uVar15);
            }
          }
        }
LAB_002e1b4a:
        iVar17 = UnicodeString::moveIndex32(&inString,(int)local_238,1);
        local_238 = (_func_int **)CONCAT44(local_238._4_4_,iVar17);
        uVar24 = uVar24 + 1;
      } while (uVar24 != uVar23);
    }
    utext_close_63(&fu);
    UVector32::UVector32(&t_boundary,iVar20,&status);
    iVar8 = (int)uVar11;
    if (((iVar8 < 0) || (bestSnlp.count <= iVar8)) || (bestSnlp.elements[uVar23] != -1)) {
      if (iVar8 < 1) {
        uVar23 = 0;
      }
      else {
        uVar9 = 1;
        do {
          uVar23 = (ulong)uVar9;
          if (((-2 < t_boundary.count) && (t_boundary.count < t_boundary.capacity)) ||
             (UVar5 = UVector32::expandCapacity(&t_boundary,t_boundary.count + 1,&status),
             UVar5 != '\0')) {
            t_boundary.elements[t_boundary.count] = (int)uVar11;
            t_boundary.count = t_boundary.count + 1;
          }
          if (prev.count <= (int)uVar11) break;
          uVar24 = uVar11 & 0xffffffff;
          uVar11 = (ulong)(uint)prev.elements[uVar24];
          uVar9 = uVar9 + 1;
        } while (0 < prev.elements[uVar24]);
      }
    }
    else {
      if (((-2 < t_boundary.count) && (t_boundary.count < t_boundary.capacity)) ||
         (UVar5 = UVector32::expandCapacity(&t_boundary,t_boundary.count + 1,&status), UVar5 != '\0'
         )) {
        t_boundary.elements[t_boundary.count] = iVar8;
        t_boundary.count = t_boundary.count + 1;
      }
      uVar23 = 1;
    }
    uVar9 = foundBreaks->count;
    if ((ulong)uVar9 == 0) {
LAB_002e1d4e:
      if (((-2 < t_boundary.count) && (t_boundary.count < t_boundary.capacity)) ||
         (UVar5 = UVector32::expandCapacity(&t_boundary,t_boundary.count + 1,&status), UVar5 != '\0'
         )) {
        t_boundary.elements[t_boundary.count] = 0;
        t_boundary.count = t_boundary.count + 1;
      }
      uVar23 = (ulong)((int)uVar23 + 1);
    }
    else {
      if ((int)uVar9 < 1) {
        iVar8 = 0;
      }
      else {
        iVar8 = foundBreaks->elements[(ulong)uVar9 - 1];
      }
      if (iVar8 < (int)local_228) goto LAB_002e1d4e;
    }
    iVar17 = (int32_t)uVar23;
    if (0 < iVar17) {
      uVar11 = uVar23;
      iVar8 = -1;
      do {
        uVar24 = 0;
        if ((long)uVar11 <= (long)t_boundary.count) {
          uVar24 = (ulong)(uint)t_boundary.elements[uVar11 - 1];
        }
        iVar20 = (int)uVar24;
        if (this_00 == (UVector32 *)0x0) {
          iVar16 = iVar20 + (int)local_228;
        }
        else {
          iVar16 = 0;
          if ((-1 < iVar20) && (iVar20 < this_00->count)) {
            iVar16 = this_00->elements[uVar24];
          }
        }
        if (iVar8 < iVar16) {
          iVar8 = foundBreaks->count;
          if ((iVar8 < -1) || (foundBreaks->capacity <= iVar8)) {
            UVar5 = UVector32::expandCapacity(foundBreaks,iVar8 + 1,&status);
            if (UVar5 == '\0') goto LAB_002e1e19;
            iVar8 = foundBreaks->count;
          }
          foundBreaks->elements[iVar8] = iVar16;
          foundBreaks->count = foundBreaks->count + 1;
        }
        else {
          uVar23 = (ulong)((int)uVar23 - 1);
        }
LAB_002e1e19:
        iVar17 = (int32_t)uVar23;
        bVar3 = 1 < uVar11;
        uVar11 = uVar11 - 1;
        iVar8 = iVar16;
      } while (bVar3);
    }
    UVector32::~UVector32(&t_boundary);
    UVector32::~UVector32(&lengths);
    UVector32::~UVector32(&values);
    UVector32::~UVector32(&prev);
    UVector32::~UVector32(&bestSnlp);
  }
  if (this_00 != (UVector32 *)0x0) {
    (*(this_00->super_UObject)._vptr_UObject[1])(this_00);
  }
LAB_002e1e77:
  UnicodeString::~UnicodeString(&inString);
  return iVar17;
}

Assistant:

int32_t 
CjkBreakEngine::divideUpDictionaryRange( UText *inText,
        int32_t rangeStart,
        int32_t rangeEnd,
        UVector32 &foundBreaks ) const {
    if (rangeStart >= rangeEnd) {
        return 0;
    }

    // UnicodeString version of input UText, NFKC normalized if necessary.
    UnicodeString inString;

    // inputMap[inStringIndex] = corresponding native index from UText inText.
    // If NULL then mapping is 1:1
    LocalPointer<UVector32>     inputMap;

    UErrorCode     status      = U_ZERO_ERROR;


    // if UText has the input string as one contiguous UTF-16 chunk
    if ((inText->providerProperties & utext_i32_flag(UTEXT_PROVIDER_STABLE_CHUNKS)) &&
         inText->chunkNativeStart <= rangeStart &&
         inText->chunkNativeLimit >= rangeEnd   &&
         inText->nativeIndexingLimit >= rangeEnd - inText->chunkNativeStart) {

        // Input UText is in one contiguous UTF-16 chunk.
        // Use Read-only aliasing UnicodeString.
        inString.setTo(FALSE,
                       inText->chunkContents + rangeStart - inText->chunkNativeStart,
                       rangeEnd - rangeStart);
    } else {
        // Copy the text from the original inText (UText) to inString (UnicodeString).
        // Create a map from UnicodeString indices -> UText offsets.
        utext_setNativeIndex(inText, rangeStart);
        int32_t limit = rangeEnd;
        U_ASSERT(limit <= utext_nativeLength(inText));
        if (limit > utext_nativeLength(inText)) {
            limit = (int32_t)utext_nativeLength(inText);
        }
        inputMap.adoptInsteadAndCheckErrorCode(new UVector32(status), status);
        if (U_FAILURE(status)) {
            return 0;
        }
        while (utext_getNativeIndex(inText) < limit) {
            int32_t nativePosition = (int32_t)utext_getNativeIndex(inText);
            UChar32 c = utext_next32(inText);
            U_ASSERT(c != U_SENTINEL);
            inString.append(c);
            while (inputMap->size() < inString.length()) {
                inputMap->addElement(nativePosition, status);
            }
        }
        inputMap->addElement(limit, status);
    }


    if (!nfkcNorm2->isNormalized(inString, status)) {
        UnicodeString normalizedInput;
        //  normalizedMap[normalizedInput position] ==  original UText position.
        LocalPointer<UVector32> normalizedMap(new UVector32(status), status);
        if (U_FAILURE(status)) {
            return 0;
        }
        
        UnicodeString fragment;
        UnicodeString normalizedFragment;
        for (int32_t srcI = 0; srcI < inString.length();) {  // Once per normalization chunk
            fragment.remove();
            int32_t fragmentStartI = srcI;
            UChar32 c = inString.char32At(srcI);
            for (;;) {
                fragment.append(c);
                srcI = inString.moveIndex32(srcI, 1);
                if (srcI == inString.length()) {
                    break;
                }
                c = inString.char32At(srcI);
                if (nfkcNorm2->hasBoundaryBefore(c)) {
                    break;
                }
            }
            nfkcNorm2->normalize(fragment, normalizedFragment, status);
            normalizedInput.append(normalizedFragment);

            // Map every position in the normalized chunk to the start of the chunk
            //   in the original input.
            int32_t fragmentOriginalStart = inputMap.isValid() ?
                    inputMap->elementAti(fragmentStartI) : fragmentStartI+rangeStart;
            while (normalizedMap->size() < normalizedInput.length()) {
                normalizedMap->addElement(fragmentOriginalStart, status);
                if (U_FAILURE(status)) {
                    break;
                }
            }
        }
        U_ASSERT(normalizedMap->size() == normalizedInput.length());
        int32_t nativeEnd = inputMap.isValid() ?
                inputMap->elementAti(inString.length()) : inString.length()+rangeStart;
        normalizedMap->addElement(nativeEnd, status);

        inputMap.moveFrom(normalizedMap);
        inString.moveFrom(normalizedInput);
    }

    int32_t numCodePts = inString.countChar32();
    if (numCodePts != inString.length()) {
        // There are supplementary characters in the input.
        // The dictionary will produce boundary positions in terms of code point indexes,
        //   not in terms of code unit string indexes.
        // Use the inputMap mechanism to take care of this in addition to indexing differences
        //    from normalization and/or UTF-8 input.
        UBool hadExistingMap = inputMap.isValid();
        if (!hadExistingMap) {
            inputMap.adoptInsteadAndCheckErrorCode(new UVector32(status), status);
            if (U_FAILURE(status)) {
                return 0;
            }
        }
        int32_t cpIdx = 0;
        for (int32_t cuIdx = 0; ; cuIdx = inString.moveIndex32(cuIdx, 1)) {
            U_ASSERT(cuIdx >= cpIdx);
            if (hadExistingMap) {
                inputMap->setElementAt(inputMap->elementAti(cuIdx), cpIdx);
            } else {
                inputMap->addElement(cuIdx+rangeStart, status);
            }
            cpIdx++;
            if (cuIdx == inString.length()) {
               break;
            }
        }
    }
                
    // bestSnlp[i] is the snlp of the best segmentation of the first i
    // code points in the range to be matched.
    UVector32 bestSnlp(numCodePts + 1, status);
    bestSnlp.addElement(0, status);
    for(int32_t i = 1; i <= numCodePts; i++) {
        bestSnlp.addElement(kuint32max, status);
    }


    // prev[i] is the index of the last CJK code point in the previous word in 
    // the best segmentation of the first i characters.
    UVector32 prev(numCodePts + 1, status);
    for(int32_t i = 0; i <= numCodePts; i++){
        prev.addElement(-1, status);
    }

    const int32_t maxWordSize = 20;
    UVector32 values(numCodePts, status);
    values.setSize(numCodePts);
    UVector32 lengths(numCodePts, status);
    lengths.setSize(numCodePts);

    UText fu = UTEXT_INITIALIZER;
    utext_openUnicodeString(&fu, &inString, &status);

    // Dynamic programming to find the best segmentation.

    // In outer loop, i  is the code point index,
    //                ix is the corresponding string (code unit) index.
    //    They differ when the string contains supplementary characters.
    int32_t ix = 0;
    bool is_prev_katakana = false;
    for (int32_t i = 0;  i < numCodePts;  ++i, ix = inString.moveIndex32(ix, 1)) {
        if ((uint32_t)bestSnlp.elementAti(i) == kuint32max) {
            continue;
        }

        int32_t count;
        utext_setNativeIndex(&fu, ix);
        count = fDictionary->matches(&fu, maxWordSize, numCodePts,
                             NULL, lengths.getBuffer(), values.getBuffer(), NULL);
                             // Note: lengths is filled with code point lengths
                             //       The NULL parameter is the ignored code unit lengths.

        // if there are no single character matches found in the dictionary 
        // starting with this character, treat character as a 1-character word 
        // with the highest value possible, i.e. the least likely to occur.
        // Exclude Korean characters from this treatment, as they should be left
        // together by default.
        if ((count == 0 || lengths.elementAti(0) != 1) &&
                !fHangulWordSet.contains(inString.char32At(ix))) {
            values.setElementAt(maxSnlp, count);   // 255
            lengths.setElementAt(1, count++);
        }

        for (int32_t j = 0; j < count; j++) {
            uint32_t newSnlp = (uint32_t)bestSnlp.elementAti(i) + (uint32_t)values.elementAti(j);
            int32_t ln_j_i = lengths.elementAti(j) + i;
            if (newSnlp < (uint32_t)bestSnlp.elementAti(ln_j_i)) {
                bestSnlp.setElementAt(newSnlp, ln_j_i);
                prev.setElementAt(i, ln_j_i);
            }
        }

        // In Japanese,
        // Katakana word in single character is pretty rare. So we apply
        // the following heuristic to Katakana: any continuous run of Katakana
        // characters is considered a candidate word with a default cost
        // specified in the katakanaCost table according to its length.

        bool is_katakana = isKatakana(inString.char32At(ix));
        int32_t katakanaRunLength = 1;
        if (!is_prev_katakana && is_katakana) {
            int32_t j = inString.moveIndex32(ix, 1);
            // Find the end of the continuous run of Katakana characters
            while (j < inString.length() && katakanaRunLength < kMaxKatakanaGroupLength &&
                    isKatakana(inString.char32At(j))) {
                j = inString.moveIndex32(j, 1);
                katakanaRunLength++;
            }
            if (katakanaRunLength < kMaxKatakanaGroupLength) {
                uint32_t newSnlp = bestSnlp.elementAti(i) + getKatakanaCost(katakanaRunLength);
                if (newSnlp < (uint32_t)bestSnlp.elementAti(i+katakanaRunLength)) {
                    bestSnlp.setElementAt(newSnlp, i+katakanaRunLength);
                    prev.setElementAt(i, i+katakanaRunLength);  // prev[j] = i;
                }
            }
        }
        is_prev_katakana = is_katakana;
    }
    utext_close(&fu);

    // Start pushing the optimal offset index into t_boundary (t for tentative).
    // prev[numCodePts] is guaranteed to be meaningful.
    // We'll first push in the reverse order, i.e.,
    // t_boundary[0] = numCodePts, and afterwards do a swap.
    UVector32 t_boundary(numCodePts+1, status);

    int32_t numBreaks = 0;
    // No segmentation found, set boundary to end of range
    if ((uint32_t)bestSnlp.elementAti(numCodePts) == kuint32max) {
        t_boundary.addElement(numCodePts, status);
        numBreaks++;
    } else {
        for (int32_t i = numCodePts; i > 0; i = prev.elementAti(i)) {
            t_boundary.addElement(i, status);
            numBreaks++;
        }
        U_ASSERT(prev.elementAti(t_boundary.elementAti(numBreaks - 1)) == 0);
    }

    // Add a break for the start of the dictionary range if there is not one
    // there already.
    if (foundBreaks.size() == 0 || foundBreaks.peeki() < rangeStart) {
        t_boundary.addElement(0, status);
        numBreaks++;
    }

    // Now that we're done, convert positions in t_boundary[] (indices in 
    // the normalized input string) back to indices in the original input UText
    // while reversing t_boundary and pushing values to foundBreaks.
    int32_t prevCPPos = -1;
    int32_t prevUTextPos = -1;
    for (int32_t i = numBreaks-1; i >= 0; i--) {
        int32_t cpPos = t_boundary.elementAti(i);
        U_ASSERT(cpPos > prevCPPos);
        int32_t utextPos =  inputMap.isValid() ? inputMap->elementAti(cpPos) : cpPos + rangeStart;
        U_ASSERT(utextPos >= prevUTextPos);
        if (utextPos > prevUTextPos) {
            // Boundaries are added to foundBreaks output in ascending order.
            U_ASSERT(foundBreaks.size() == 0 || foundBreaks.peeki() < utextPos);
            foundBreaks.push(utextPos, status);
        } else {
            // Normalization expanded the input text, the dictionary found a boundary
            // within the expansion, giving two boundaries with the same index in the
            // original text. Ignore the second. See ticket #12918.
            --numBreaks;
        }
        prevCPPos = cpPos;
        prevUTextPos = utextPos;
    }
    (void)prevCPPos; // suppress compiler warnings about unused variable

    // inString goes out of scope
    // inputMap goes out of scope
    return numBreaks;
}